

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec_loop.c
# Opt level: O0

void dec_loop_ssse3(uint8_t **s,size_t *slen,uint8_t **o,size_t *olen)

{
  int iVar1;
  ulong local_30;
  size_t rounds;
  size_t *olen_local;
  uint8_t **o_local;
  size_t *slen_local;
  uint8_t **s_local;
  
  if (*slen < 0x18) {
    return;
  }
  local_30 = *slen - 8 >> 4;
  *slen = *slen + local_30 * -0x10;
  *olen = local_30 * 0xc + *olen;
  rounds = (size_t)olen;
  olen_local = (size_t *)o;
  o_local = (uint8_t **)slen;
  slen_local = (size_t *)s;
  do {
    if (local_30 < 8) {
      if (local_30 < 4) {
        if (local_30 < 2) {
          dec_loop_ssse3_inner((uint8_t **)slen_local,(uint8_t **)olen_local,&local_30);
LAB_0010ba73:
          *o_local = *o_local + local_30 * 0x10;
          *(ulong *)rounds = *(long *)rounds + local_30 * -0xc;
          return;
        }
        iVar1 = dec_loop_ssse3_inner((uint8_t **)slen_local,(uint8_t **)olen_local,&local_30);
        if (iVar1 == 0) goto LAB_0010ba73;
        iVar1 = dec_loop_ssse3_inner((uint8_t **)slen_local,(uint8_t **)olen_local,&local_30);
      }
      else {
        iVar1 = dec_loop_ssse3_inner((uint8_t **)slen_local,(uint8_t **)olen_local,&local_30);
        if (((iVar1 == 0) ||
            (iVar1 = dec_loop_ssse3_inner((uint8_t **)slen_local,(uint8_t **)olen_local,&local_30),
            iVar1 == 0)) ||
           (iVar1 = dec_loop_ssse3_inner((uint8_t **)slen_local,(uint8_t **)olen_local,&local_30),
           iVar1 == 0)) goto LAB_0010ba73;
        iVar1 = dec_loop_ssse3_inner((uint8_t **)slen_local,(uint8_t **)olen_local,&local_30);
      }
    }
    else {
      iVar1 = dec_loop_ssse3_inner((uint8_t **)slen_local,(uint8_t **)olen_local,&local_30);
      if (((((iVar1 == 0) ||
            (iVar1 = dec_loop_ssse3_inner((uint8_t **)slen_local,(uint8_t **)olen_local,&local_30),
            iVar1 == 0)) ||
           (iVar1 = dec_loop_ssse3_inner((uint8_t **)slen_local,(uint8_t **)olen_local,&local_30),
           iVar1 == 0)) ||
          ((iVar1 = dec_loop_ssse3_inner((uint8_t **)slen_local,(uint8_t **)olen_local,&local_30),
           iVar1 == 0 ||
           (iVar1 = dec_loop_ssse3_inner((uint8_t **)slen_local,(uint8_t **)olen_local,&local_30),
           iVar1 == 0)))) ||
         ((iVar1 = dec_loop_ssse3_inner((uint8_t **)slen_local,(uint8_t **)olen_local,&local_30),
          iVar1 == 0 ||
          (iVar1 = dec_loop_ssse3_inner((uint8_t **)slen_local,(uint8_t **)olen_local,&local_30),
          iVar1 == 0)))) goto LAB_0010ba73;
      iVar1 = dec_loop_ssse3_inner((uint8_t **)slen_local,(uint8_t **)olen_local,&local_30);
    }
    if ((iVar1 == 0) || (local_30 == 0)) goto LAB_0010ba73;
  } while( true );
}

Assistant:

static inline void
dec_loop_ssse3 (const uint8_t **s, size_t *slen, uint8_t **o, size_t *olen)
{
	if (*slen < 24) {
		return;
	}

	// Process blocks of 16 bytes per round. Because 4 extra zero bytes are
	// written after the output, ensure that there will be at least 8 bytes
	// of input data left to cover the gap. (6 data bytes and up to two
	// end-of-string markers.)
	size_t rounds = (*slen - 8) / 16;

	*slen -= rounds * 16;	// 16 bytes consumed per round
	*olen += rounds * 12;	// 12 bytes produced per round

	do {
		if (rounds >= 8) {
			if (dec_loop_ssse3_inner(s, o, &rounds) &&
			    dec_loop_ssse3_inner(s, o, &rounds) &&
			    dec_loop_ssse3_inner(s, o, &rounds) &&
			    dec_loop_ssse3_inner(s, o, &rounds) &&
			    dec_loop_ssse3_inner(s, o, &rounds) &&
			    dec_loop_ssse3_inner(s, o, &rounds) &&
			    dec_loop_ssse3_inner(s, o, &rounds) &&
			    dec_loop_ssse3_inner(s, o, &rounds)) {
				continue;
			}
			break;
		}
		if (rounds >= 4) {
			if (dec_loop_ssse3_inner(s, o, &rounds) &&
			    dec_loop_ssse3_inner(s, o, &rounds) &&
			    dec_loop_ssse3_inner(s, o, &rounds) &&
			    dec_loop_ssse3_inner(s, o, &rounds)) {
				continue;
			}
			break;
		}
		if (rounds >= 2) {
			if (dec_loop_ssse3_inner(s, o, &rounds) &&
			    dec_loop_ssse3_inner(s, o, &rounds)) {
				continue;
			}
			break;
		}
		dec_loop_ssse3_inner(s, o, &rounds);
		break;

	} while (rounds > 0);

	// Adjust for any rounds that were skipped:
	*slen += rounds * 16;
	*olen -= rounds * 12;
}